

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O0

int __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>::ConnectOrder
          (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this,int connect)

{
  byte bVar1;
  int iVar2;
  TPZConnect *this_00;
  int in_ESI;
  long *in_RDI;
  TPZConnect *c;
  
  if ((-1 < in_ESI) && (iVar2 = (**(code **)(*in_RDI + 0x90))(), in_ESI < iVar2)) {
    this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,in_ESI);
    bVar1 = TPZConnect::Order(this_00);
    return (uint)bVar1;
  }
  return -1;
}

Assistant:

int TPZCompElHDivCollapsed<TSHAPE>::ConnectOrder(int connect) const {
	if (connect < 0 || connect >= NConnects()){
#ifdef PZ_LOG
		{
			std::stringstream sout;
			sout << "Connect index out of range connect " << connect <<
			" nconnects " << NConnects();
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
		return -1;
	}

    TPZConnect &c = this->Connect(connect);
    return c.Order();
}